

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::PrintUTF8ErrorLog
               (char *field_name,char *operation_str,bool emit_stacktrace)

{
  LogMessage *pLVar1;
  LogFinisher local_d1;
  LogMessage local_d0;
  string local_98;
  allocator local_61;
  undefined1 local_60 [8];
  string quoted_field_name;
  string stacktrace;
  bool emit_stacktrace_local;
  char *operation_str_local;
  char *field_name_local;
  
  std::__cxx11::string::string((string *)(quoted_field_name.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,"",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (field_name != (char *)0x0) {
    StringPrintf_abi_cxx11_(&local_98," \'%s\'",field_name);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  LogMessage::LogMessage
            (&local_d0,LOGLEVEL_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
             ,0x245);
  pLVar1 = LogMessage::operator<<(&local_d0,"String field");
  pLVar1 = LogMessage::operator<<(pLVar1,(string *)local_60);
  pLVar1 = LogMessage::operator<<(pLVar1," contains invalid ");
  pLVar1 = LogMessage::operator<<(pLVar1,"UTF-8 data when ");
  pLVar1 = LogMessage::operator<<(pLVar1,operation_str);
  pLVar1 = LogMessage::operator<<(pLVar1," a protocol ");
  pLVar1 = LogMessage::operator<<
                     (pLVar1,"buffer. Use the \'bytes\' type if you intend to send raw ");
  pLVar1 = LogMessage::operator<<(pLVar1,"bytes. ");
  pLVar1 = LogMessage::operator<<(pLVar1,(string *)((long)&quoted_field_name.field_2 + 8));
  LogFinisher::operator=(&local_d1,pLVar1);
  LogMessage::~LogMessage(&local_d0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(quoted_field_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void PrintUTF8ErrorLog(const char* field_name, const char* operation_str,
                       bool emit_stacktrace) {
  std::string stacktrace;
  (void)emit_stacktrace;  // Parameter is used by Google-internal code.
  std::string quoted_field_name = "";
  if (field_name != nullptr) {
    quoted_field_name = StringPrintf(" '%s'", field_name);
  }
  GOOGLE_LOG(ERROR) << "String field" << quoted_field_name << " contains invalid "
             << "UTF-8 data when " << operation_str << " a protocol "
             << "buffer. Use the 'bytes' type if you intend to send raw "
             << "bytes. " << stacktrace;
}